

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::SetObjectGen(GC *this,GCObject *obj,GCGeneration gen)

{
  long *plVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  GenInfo *gen_info;
  long *local_20;
  
  local_20 = (long *)0x0;
  plVar1 = in_RDI;
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      plVar1 = in_RDI + 2;
    }
    else {
      plVar1 = local_20;
      if (in_EDX == 2) {
        plVar1 = in_RDI + 4;
      }
    }
  }
  local_20 = plVar1;
  if (local_20 == (long *)0x0) {
    __assert_fail("gen_info",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/GC.cpp",
                  0xef,"void luna::GC::SetObjectGen(GCObject *, GCGeneration)");
  }
  *(byte *)(in_RSI + 0x10) = *(byte *)(in_RSI + 0x10) & 0xfc | (byte)in_EDX & 3;
  *(long *)(in_RSI + 8) = *local_20;
  *local_20 = in_RSI;
  *(int *)(local_20 + 1) = (int)local_20[1] + 1;
  return;
}

Assistant:

void GC::SetObjectGen(GCObject *obj, GCGeneration gen)
    {
        GenInfo *gen_info = nullptr;

        switch (gen)
        {
            case GCGen0:
                gen_info = &gen0_;
                break;
            case GCGen1:
                gen_info = &gen1_;
                break;
            case GCGen2:
                gen_info = &gen2_;
                break;
        }

        assert(gen_info);

        obj->generation_ = gen;
        obj->next_ = gen_info->gen_;
        gen_info->gen_ = obj;
        gen_info->count_++;
    }